

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void lhCellDiscard(lhcell *pCell)

{
  lhcell *plVar1;
  lhpage *plVar2;
  lhcell *plVar3;
  lhcell **pplVar4;
  
  plVar1 = pCell->pNextCol;
  plVar2 = pCell->pPage->pMaster;
  if (pCell->pPrevCol == (lhcell *)0x0) {
    pplVar4 = plVar2->apCell + (plVar2->nCellSize - 1 & pCell->nHash);
  }
  else {
    pplVar4 = &pCell->pPrevCol->pNextCol;
  }
  *pplVar4 = plVar1;
  if (plVar1 != (lhcell *)0x0) {
    plVar1->pPrevCol = pCell->pPrevCol;
  }
  if (plVar2->pList == pCell) {
    plVar2->pList = plVar2->pList->pNext;
  }
  plVar1 = pCell->pNext;
  plVar3 = pCell->pPrev;
  if (plVar3 != (lhcell *)0x0) {
    plVar3->pNext = plVar1;
  }
  if (plVar1 != (lhcell *)0x0) {
    plVar1->pPrev = plVar3;
  }
  if (plVar2->pFirst == pCell) {
    plVar2->pFirst = pCell->pPrev;
  }
  plVar2->nCell = plVar2->nCell - 1;
  SyBlobRelease(&pCell->sKey);
  SyMemBackendPoolFree(&plVar2->pHash->sAllocator,pCell);
  return;
}

Assistant:

static void lhCellDiscard(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;	
	
	if( pCell->pPrevCol ){
		pCell->pPrevCol->pNextCol = pCell->pNextCol;
	}else{
		pPage->apCell[pCell->nHash & (pPage->nCellSize - 1)] = pCell->pNextCol;
	}
	if( pCell->pNextCol ){
		pCell->pNextCol->pPrevCol = pCell->pPrevCol;
	}
	MACRO_LD_REMOVE(pPage->pList,pCell);
	if( pCell == pPage->pFirst ){
		pPage->pFirst = pCell->pPrev;
	}
	pPage->nCell--;
	/* Release the cell */
	SyBlobRelease(&pCell->sKey);
	SyMemBackendPoolFree(&pPage->pHash->sAllocator,pCell);
}